

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_gotoxy(wchar_t x,wchar_t y)

{
  wchar_t h;
  wchar_t w;
  wchar_t y_local;
  wchar_t x_local;
  
  if ((x < L'\0') || (Term->wid <= x)) {
    y_local = L'\xffffffff';
  }
  else if ((y < L'\0') || (Term->hgt <= y)) {
    y_local = L'\xffffffff';
  }
  else {
    Term->scr->cx = x;
    Term->scr->cy = y;
    Term->scr->cu = false;
    y_local = L'\0';
  }
  return y_local;
}

Assistant:

errr Term_gotoxy(int x, int y)
{
	int w = Term->wid;
	int h = Term->hgt;

	/* Verify */
	if ((x < 0) || (x >= w)) return (-1);
	if ((y < 0) || (y >= h)) return (-1);

	/* Remember the cursor */
	Term->scr->cx = x;
	Term->scr->cy = y;

	/* The cursor is not useless */
	Term->scr->cu = 0;

	/* Success */
	return (0);
}